

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::CLOSURE_OP(SQVM *this,SQObjectPtr *target,SQFunctionProto *func,SQInteger boundtarget)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  SQObjectType SVar5;
  SQSharedState *ss;
  SQOuterVar *pSVar6;
  long lVar7;
  SQObjectPtr *pSVar8;
  SQObjectPtr *pSVar9;
  long *plVar10;
  SQTable *pSVar11;
  SQWeakRef *pSVar12;
  SQClosure *pSVar13;
  SQChar *pSVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  ss = this->_sharedstate;
  pSVar12 = SQRefCounted::GetWeakRef((this->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
  pSVar13 = SQClosure::Create(ss,func,pSVar12);
  lVar16 = func->_noutervalues;
  if (0 < lVar16) {
    lVar15 = 0x20;
    lVar17 = 0;
    do {
      pSVar6 = func->_outervalues;
      iVar3 = *(int *)((long)pSVar6 + lVar15 + -0x20);
      if (iVar3 == 1) {
        pSVar8 = ((this->ci->_closure).super_SQObject._unVal.pClosure)->_outervalues;
        lVar7 = *(long *)((long)&pSVar6->_type + lVar15);
        pSVar9 = pSVar13->_outervalues;
        uVar4 = *(uint *)((long)&(pSVar9->super_SQObject)._type + lVar17);
        plVar10 = *(long **)((long)&(pSVar9->super_SQObject)._unVal + lVar17);
        pSVar11 = pSVar8[lVar7].super_SQObject._unVal.pTable;
        *(SQTable **)((long)&(pSVar9->super_SQObject)._unVal + lVar17) = pSVar11;
        SVar5 = pSVar8[lVar7].super_SQObject._type;
        *(SQObjectType *)((long)&(pSVar9->super_SQObject)._type + lVar17) = SVar5;
        if ((SVar5 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((uVar4 >> 0x1b & 1) != 0) {
          plVar2 = plVar10 + 1;
          *plVar2 = *plVar2 + -1;
          if (*plVar2 == 0) {
            (**(code **)(*plVar10 + 0x10))();
          }
        }
      }
      else if (iVar3 == 0) {
        FindOuter(this,(SQObjectPtr *)
                       ((long)&(pSVar13->_outervalues->super_SQObject)._type + lVar17),
                  (this->_stack)._vals + this->_stackbase + *(long *)((long)&pSVar6->_type + lVar15)
                 );
      }
      lVar17 = lVar17 + 0x10;
      lVar15 = lVar15 + 0x28;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  lVar16 = func->_ndefaultparams;
  if (0 < lVar16) {
    lVar15 = 0;
    do {
      lVar17 = *(long *)((long)func->_defaultparams + lVar15);
      lVar7 = this->_stackbase;
      pSVar8 = (this->_stack)._vals;
      pSVar9 = pSVar13->_defaultparams;
      uVar4 = *(uint *)((long)&(pSVar9->super_SQObject)._type + lVar15 * 2);
      plVar10 = *(long **)((long)&(pSVar9->super_SQObject)._unVal + lVar15 * 2);
      pSVar11 = pSVar8[lVar7 + lVar17].super_SQObject._unVal.pTable;
      *(SQTable **)((long)&(pSVar9->super_SQObject)._unVal + lVar15 * 2) = pSVar11;
      SVar5 = pSVar8[lVar7 + lVar17].super_SQObject._type;
      *(SQObjectType *)((long)&(pSVar9->super_SQObject)._type + lVar15 * 2) = SVar5;
      if ((SVar5 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      lVar15 = lVar15 + 8;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  if (boundtarget == 0xff) goto LAB_00121b4f;
  pSVar8 = (this->_stack)._vals;
  SVar5 = pSVar8[this->_stackbase + boundtarget].super_SQObject._type;
  if ((int)SVar5 < 0xa000020) {
    if ((SVar5 != OT_ARRAY) && (SVar5 != OT_CLASS)) goto LAB_00121c2c;
LAB_00121bc7:
    pSVar12 = SQRefCounted::GetWeakRef
                        (pSVar8[this->_stackbase + boundtarget].super_SQObject._unVal.pRefCounted,
                         SVar5);
    pSVar13->_env = pSVar12;
    pSVar1 = &(pSVar12->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  else {
    if ((SVar5 == OT_INSTANCE) || (SVar5 == OT_TABLE)) goto LAB_00121bc7;
LAB_00121c2c:
    pSVar14 = IdType2Name(SVar5);
    Raise_Error(this,"cannot bind a %s as environment object",pSVar14);
    (*(pSVar13->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])(pSVar13);
  }
  if ((int)SVar5 < 0xa000020) {
    if ((SVar5 != OT_ARRAY) && (SVar5 != OT_CLASS)) {
      return false;
    }
  }
  else if ((SVar5 != OT_INSTANCE) && (SVar5 != OT_TABLE)) {
    return false;
  }
LAB_00121b4f:
  pSVar11 = (target->super_SQObject)._unVal.pTable;
  SVar5 = (target->super_SQObject)._type;
  (target->super_SQObject)._type = OT_CLOSURE;
  (target->super_SQObject)._unVal.pClosure = pSVar13;
  pSVar1 = &(pSVar13->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])()
      ;
    }
  }
  return true;
}

Assistant:

bool SQVM::CLOSURE_OP(SQObjectPtr &target, SQFunctionProto *func,SQInteger boundtarget)
{
    SQInteger nouters;
    SQClosure *closure = SQClosure::Create(_ss(this), func,_table(_roottable)->GetWeakRef(OT_TABLE));
    if((nouters = func->_noutervalues)) {
        for(SQInteger i = 0; i<nouters; i++) {
            SQOuterVar &v = func->_outervalues[i];
            switch(v._type){
            case otLOCAL:
                FindOuter(closure->_outervalues[i], &STK(_integer(v._src)));
                break;
            case otOUTER:
                closure->_outervalues[i] = _closure(ci->_closure)->_outervalues[_integer(v._src)];
                break;
            }
        }
    }
    SQInteger ndefparams;
    if((ndefparams = func->_ndefaultparams)) {
        for(SQInteger i = 0; i < ndefparams; i++) {
            SQInteger spos = func->_defaultparams[i];
            closure->_defaultparams[i] = _stack._vals[_stackbase + spos];
        }
    }
	if (boundtarget != 0xFF) {
		SQObjectPtr &val = _stack._vals[_stackbase + boundtarget];
		SQObjectType t = sq_type(val);
		if (t == OT_TABLE || t == OT_CLASS || t == OT_INSTANCE || t == OT_ARRAY) {
			closure->_env = _refcounted(val)->GetWeakRef(t);
			__ObjAddRef(closure->_env);
		}
		else {
			Raise_Error(_SC("cannot bind a %s as environment object"), IdType2Name(t));
			closure->Release();
			return false;
		}
	}
    target = closure;
    return true;

}